

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O0

void easm_print_mods(FILE *out,envy_colors *cols,easm_mods *mods,int spcafter)

{
  int local_28;
  int i;
  int spcafter_local;
  easm_mods *mods_local;
  envy_colors *cols_local;
  FILE *out_local;
  
  for (local_28 = 0; local_28 < mods->modsnum; local_28 = local_28 + 1) {
    if (spcafter == 0) {
      fprintf((FILE *)out," ");
    }
    easm_print_mod(out,cols,mods->mods[local_28]);
    if (spcafter != 0) {
      fprintf((FILE *)out," ");
    }
  }
  return;
}

Assistant:

void easm_print_mods(FILE *out, const struct envy_colors *cols, struct easm_mods *mods, int spcafter) {
	int i;
	for (i = 0; i < mods->modsnum; i++) {
		if (!spcafter)
			fprintf(out, " ");
		easm_print_mod(out, cols, mods->mods[i]);
		if (spcafter)
			fprintf(out, " ");
	}
}